

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerBailOnEqualOrNotEqual
          (Lowerer *this,Instr *instr,BranchInstr *branchInstr,LabelInstr *labelBailOut,
          PropertySymOpnd *propSymOpnd,bool isHelper)

{
  Instr *pIVar1;
  bool bVar2;
  IRType IVar3;
  BailOutKind BVar4;
  BailOutKind e1;
  uint32 uVar5;
  Opnd *pOVar6;
  IntConstOpnd *testSrc2;
  IntConstOpnd *src2;
  IntConstOpnd *src2_00;
  LabelInstr *target;
  RegOpnd *dst;
  Instr *this_00;
  JITTimeProfileInfo *this_01;
  intptr_t iVar7;
  MemRefOpnd *dst_00;
  Opnd *profiledFlags;
  intptr_t infoAddr;
  Instr *andInstr;
  LabelInstr *label;
  Opnd *fldInfoAccessor;
  Opnd *maskNoImplicitCall;
  Opnd *accessorImplicitCall;
  Opnd *implicitCallFlags;
  bool onEqual;
  Instr *prevInstr;
  bool isHelper_local;
  PropertySymOpnd *propSymOpnd_local;
  LabelInstr *labelBailOut_local;
  BranchInstr *branchInstr_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  pIVar1 = instr->m_prev;
  LowerBailoutCheckAndLabel(this,instr,instr->m_opcode == BailOnEqual,isHelper);
  if (propSymOpnd != (PropertySymOpnd *)0x0) {
    BVar4 = IR::Instr::GetBailOutKind(instr);
    e1 = IR::operator~(BailOutKindBits);
    BVar4 = IR::operator&(BVar4,e1);
    if (((BVar4 == BailOutOnImplicitCalls) && (propSymOpnd->m_inlineCacheIndex != 0xffffffff)) &&
       (bVar2 = Func::HasProfileInfo(instr->m_func), bVar2)) {
      pOVar6 = GetImplicitCallFlagsOpnd(this);
      IVar3 = GetImplicitCallFlagsType();
      testSrc2 = IR::IntConstOpnd::New(4,IVar3,instr->m_func,true);
      IVar3 = GetImplicitCallFlagsType();
      src2 = IR::IntConstOpnd::New(0xfe,IVar3,instr->m_func,true);
      IVar3 = GetFldInfoFlagsType();
      src2_00 = IR::IntConstOpnd::New(0x18,IVar3,instr->m_func,true);
      target = IR::LabelInstr::New(Label,instr->m_func,true);
      IVar3 = GetImplicitCallFlagsType();
      dst = IR::RegOpnd::New(IVar3,instr->m_func);
      this_00 = InsertAnd(&dst->super_Opnd,pOVar6,&src2->super_Opnd,instr);
      pOVar6 = IR::Instr::GetDst(this_00);
      InsertTestBranch(pOVar6,&testSrc2->super_Opnd,BrEq_A,target,instr);
      this_01 = Func::GetReadOnlyProfileInfo(instr->m_func);
      iVar7 = JITTimeProfileInfo::GetFldInfoAddr(this_01,propSymOpnd->m_inlineCacheIndex);
      uVar5 = Js::FldInfo::GetOffsetOfFlags();
      dst_00 = IR::MemRefOpnd::New(iVar7 + (ulong)uVar5,TyInt8,instr->m_func,AddrOpndKindDynamicMisc
                                  );
      InsertOr(&dst_00->super_Opnd,&dst_00->super_Opnd,&src2_00->super_Opnd,instr);
      IR::Instr::InsertBefore(instr,&target->super_Instr);
    }
  }
  GenerateBailOut(this,instr,branchInstr,labelBailOut,(LabelInstr *)0x0);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerBailOnEqualOrNotEqual(IR::Instr * instr,
    IR::BranchInstr *branchInstr, // = nullptr
    IR::LabelInstr *labelBailOut, // = nullptr
    IR::PropertySymOpnd * propSymOpnd, // = nullptr
    bool isHelper)                // = false
{
    IR::Instr * prevInstr = instr->m_prev;

    // Bail out test
    bool onEqual = instr->m_opcode == Js::OpCode::BailOnEqual;

    LowerBailoutCheckAndLabel(instr, onEqual, isHelper);

    // BailOutOnImplicitCalls is a post-op bailout. Since we look at the profile info for LdFld/StFld to decide whether the instruction may or may not call an accessor,
    // we need to update this profile information on the bailout path for BailOutOnImplicitCalls if the implicit call was an accessor call.
    if(propSymOpnd && ((instr->GetBailOutKind() & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCalls) && (propSymOpnd->m_inlineCacheIndex != -1) &&
        instr->m_func->HasProfileInfo())
    {
        // result = AND implCallFlags, ~ImplicitCall_None
        //          TST result, ImplicitCall_Accessor
        //          JEQ $bail
        //          OR profiledFlags, ( FldInfo_FromAccessor | FldInfo_Polymorphic )
        //          $bail

        IR::Opnd * implicitCallFlags = GetImplicitCallFlagsOpnd();
        IR::Opnd * accessorImplicitCall = IR::IntConstOpnd::New(Js::ImplicitCall_Accessor & ~Js::ImplicitCall_None, GetImplicitCallFlagsType(), instr->m_func, true);
        IR::Opnd * maskNoImplicitCall = IR::IntConstOpnd::New((Js::ImplicitCallFlags)~Js::ImplicitCall_None, GetImplicitCallFlagsType(), instr->m_func, true);
        IR::Opnd * fldInfoAccessor = IR::IntConstOpnd::New(Js::FldInfo_FromAccessor | Js::FldInfo_Polymorphic, GetFldInfoFlagsType(), instr->m_func, true);
        IR::LabelInstr * label = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func, true);

        IR::Instr * andInstr = InsertAnd(IR::RegOpnd::New(GetImplicitCallFlagsType(), instr->m_func), implicitCallFlags, maskNoImplicitCall, instr);
        InsertTestBranch(andInstr->GetDst(), accessorImplicitCall, Js::OpCode::BrEq_A, label, instr);

        intptr_t infoAddr = instr->m_func->GetReadOnlyProfileInfo()->GetFldInfoAddr(propSymOpnd->m_inlineCacheIndex);

        IR::Opnd * profiledFlags = IR::MemRefOpnd::New(infoAddr + Js::FldInfo::GetOffsetOfFlags(), TyInt8, instr->m_func);

        InsertOr(profiledFlags, profiledFlags, fldInfoAccessor, instr);
        instr->InsertBefore(label);
    }

    this->GenerateBailOut(instr, branchInstr, labelBailOut);
    return prevInstr;
}